

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# boxed_cast_helper.hpp
# Opt level: O3

shared_ptr<TestDerivedType>
chaiscript::detail::Cast_Helper_Inner<std::shared_ptr<TestDerivedType>_>::cast
          (Boxed_Value *ob,Type_Conversions_State *param_2)

{
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var1;
  shared_ptr<TestDerivedType> *psVar2;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  shared_ptr<TestDerivedType> sVar3;
  
  psVar2 = Any::cast<std::shared_ptr<TestDerivedType>>
                     ((Any *)((long)&(((param_2->m_conversions)._M_data)->m_mutex)._M_impl._M_rwlock
                             + 0x18));
  (ob->m_data).super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>._M_ptr
       = (element_type *)
         (psVar2->super___shared_ptr<TestDerivedType,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
  p_Var1 = (psVar2->super___shared_ptr<TestDerivedType,_(__gnu_cxx::_Lock_policy)2>)._M_refcount.
           _M_pi;
  (ob->m_data).super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = p_Var1;
  if (p_Var1 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      p_Var1->_M_use_count = p_Var1->_M_use_count + 1;
      UNLOCK();
    }
    else {
      p_Var1->_M_use_count = p_Var1->_M_use_count + 1;
    }
  }
  sVar3.super___shared_ptr<TestDerivedType,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       extraout_RDX._M_pi;
  sVar3.super___shared_ptr<TestDerivedType,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)ob;
  return (shared_ptr<TestDerivedType>)
         sVar3.super___shared_ptr<TestDerivedType,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

static auto cast(const Boxed_Value &ob, const Type_Conversions_State *) { return ob.get().cast<std::shared_ptr<Result>>(); }